

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void stbi__grow_buffer_unsafe(stbi__jpeg *j)

{
  byte *pbVar1;
  byte bVar2;
  stbi_uc sVar3;
  int iVar4;
  stbi_uc *psVar5;
  stbi_uc *psVar6;
  stbi__context *psVar7;
  
  do {
    if (j->nomore == 0) {
      psVar7 = j->s;
      pbVar1 = psVar7->img_buffer;
      if (pbVar1 < psVar7->img_buffer_end) {
        psVar7->img_buffer = pbVar1 + 1;
        bVar2 = *pbVar1;
      }
      else {
        if (psVar7->read_from_callbacks == 0) goto LAB_0012d48e;
        psVar5 = psVar7->buffer_start;
        iVar4 = (*(psVar7->io).read)(psVar7->io_user_data,(char *)psVar5,psVar7->buflen);
        if (iVar4 == 0) {
          psVar7->read_from_callbacks = 0;
          psVar6 = psVar7->buffer_start + 1;
          psVar7->buffer_start[0] = '\0';
          bVar2 = 0;
        }
        else {
          psVar6 = psVar5 + iVar4;
          bVar2 = *psVar5;
        }
        psVar7->img_buffer_end = psVar6;
        psVar7->img_buffer = psVar7->buffer_start + 1;
      }
      if (bVar2 == 0xff) {
        psVar7 = j->s;
        psVar5 = psVar7->img_buffer;
        if (psVar7->img_buffer_end <= psVar5) {
          if (psVar7->read_from_callbacks != 0) goto LAB_0012d558;
          sVar3 = '\0';
          goto LAB_0012d538;
        }
        do {
          psVar7->img_buffer = psVar5 + 1;
          sVar3 = *psVar5;
LAB_0012d538:
          while( true ) {
            if (sVar3 != 0xff) {
              if (sVar3 != '\0') {
                j->marker = sVar3;
                j->nomore = 1;
                return;
              }
              bVar2 = 0xff;
              goto LAB_0012d5aa;
            }
            psVar7 = j->s;
            psVar5 = psVar7->img_buffer;
            if (psVar5 < psVar7->img_buffer_end) break;
            sVar3 = '\0';
            if (psVar7->read_from_callbacks != 0) {
LAB_0012d558:
              psVar5 = psVar7->buffer_start;
              iVar4 = (*(psVar7->io).read)(psVar7->io_user_data,(char *)psVar5,psVar7->buflen);
              if (iVar4 == 0) {
                psVar7->read_from_callbacks = 0;
                psVar6 = psVar7->buffer_start + 1;
                psVar7->buffer_start[0] = '\0';
                sVar3 = '\0';
              }
              else {
                psVar6 = psVar5 + iVar4;
                sVar3 = *psVar5;
              }
              psVar7->img_buffer_end = psVar6;
              psVar7->img_buffer = psVar7->buffer_start + 1;
            }
          }
        } while( true );
      }
    }
    else {
LAB_0012d48e:
      bVar2 = 0;
    }
LAB_0012d5aa:
    iVar4 = j->code_bits;
    j->code_buffer = j->code_buffer | (uint)bVar2 << (0x18U - (char)iVar4 & 0x1f);
    j->code_bits = iVar4 + 8;
    if (0x10 < iVar4) {
      return;
    }
  } while( true );
}

Assistant:

static void stbi__grow_buffer_unsafe(stbi__jpeg *j)
{
   do {
      int b = j->nomore ? 0 : stbi__get8(j->s);
      if (b == 0xff) {
         int c = stbi__get8(j->s);
         while (c == 0xff) c = stbi__get8(j->s); // consume fill bytes
         if (c != 0) {
            j->marker = (unsigned char) c;
            j->nomore = 1;
            return;
         }
      }
      j->code_buffer |= b << (24 - j->code_bits);
      j->code_bits += 8;
   } while (j->code_bits <= 24);
}